

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StressTest.cpp
# Opt level: O1

void __thiscall StressTester::Run(StressTester *this)

{
  int iVar1;
  Recycler *this_00;
  SimpleDictionaryEntry<Memory::WriteBarrierPtr<TestObject>,_bool> *pSVar2;
  StressTester *this_01;
  bool bVar3;
  uint uVar4;
  TestObject *pTVar5;
  Recycler *pRVar6;
  BaseDictionary<TestObject_*,_bool,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_02;
  List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_03;
  Type *pTVar7;
  int iVar8;
  ulong uVar9;
  TestObject *pTVar10;
  char memory [1456];
  TestObject *local_90;
  TestObject *local_88;
  TestObject *stack;
  StressTester *local_78;
  TestObject *local_70;
  _func_int **local_68;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  pTVar10 = (TestObject *)memory;
  local_78 = this;
  TestObject::TestObject(pTVar10,1000,0x32);
  local_68 = (_func_int **)&PTR_IsReadOnly_014ef698;
  local_88 = pTVar10;
  local_70 = pTVar10;
  do {
    this_01 = local_78;
    pTVar5 = CreateLinkedList(local_78);
    TestObject::Visit(this_01->recycler,pTVar5);
    pTVar5 = CreateTree(this_01);
    TestObject::Visit<StressTester::Run()::__0>
              (this_01->recycler,pTVar5,(anon_class_8_1_a8a4b1a8)&local_88);
    TestObject::Visit(this_01->recycler,pTVar5);
    pTVar5 = CreateRandom(this_01);
    TestObject::Visit<StressTester::Run()::__0>
              (this_01->recycler,pTVar5,(anon_class_8_1_a8a4b1a8)&local_88);
    TestObject::Visit(this_01->recycler,pTVar5);
    this_00 = this_01->recycler;
    local_60 = (undefined1  [8])
               &JsUtil::
                BaseDictionary<TestObject*,bool,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                ::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_281229e;
    data.filename._0_4_ = 0x6c;
    local_90 = pTVar10;
    pRVar6 = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_60);
    this_02 = (BaseDictionary<TestObject_*,_bool,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               *)new<Memory::Recycler>(0x38,pRVar6,0x38bbb2);
    (this_02->buckets).ptr = (int *)0x0;
    (this_02->entries).ptr = (SimpleDictionaryEntry<Memory::WriteBarrierPtr<TestObject>,_bool> *)0x0
    ;
    this_02->alloc = this_00;
    this_02->size = 0;
    this_02->bucketCount = 0;
    this_02->count = 0;
    this_02->freeCount = 0;
    this_02->modFunctionIndex = 0x4b;
    this_02->stats = (Type)0x0;
    local_60 = (undefined1  [8])
               &JsUtil::
                List<TestObject*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>::
                typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_281229e;
    data.filename._0_4_ = 0x6d;
    pRVar6 = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_60);
    this_03 = (List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
              new<Memory::Recycler>(0x30,pRVar6,0x38bbb2);
    (this_03->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).buffer.ptr =
         (WriteBarrierPtr<TestObject> *)0x0;
    (this_03->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).count = 0;
    (this_03->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).alloc = this_00;
    (this_03->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).
    _vptr_ReadOnlyList = local_68;
    this_03->length = 0;
    this_03->increment = 4;
    JsUtil::List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
              (this_03,&local_90);
    local_60[0] = 1;
    JsUtil::
    BaseDictionary<TestObject*,bool,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<TestObject*,bool,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<TestObject*,bool,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this_02,&local_90,(bool *)local_60);
    if (0 < (this_03->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).count) {
      stack = (TestObject *)&this_03->field_0x28;
      do {
        pTVar7 = JsUtil::
                 List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this_03,0);
        pTVar10 = pTVar7->ptr;
        Js::
        CopyRemovePolicy<JsUtil::List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
        ::RemoveAt((CopyRemovePolicy<JsUtil::List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
                    *)stack,this_03,0);
        TestObject::CheckCookie(pTVar10);
        if (0 < pTVar10->pointerCount) {
          iVar8 = 0;
          do {
            local_60 = (undefined1  [8])TestObject::Get(pTVar10,iVar8);
            if ((local_60 != (undefined1  [8])0x0) &&
               (bVar3 = JsUtil::
                        BaseDictionary<TestObject_*,_bool,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                        ::ContainsKey(this_02,(TestObject **)local_60), !bVar3)) {
              data._39_1_ = 1;
              JsUtil::
              BaseDictionary<TestObject*,bool,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::
              Insert<(JsUtil::BaseDictionary<TestObject*,bool,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                        ((BaseDictionary<TestObject*,bool,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)this_02,(TestObject **)local_60,(bool *)&data.field_0x27);
              JsUtil::
              List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
              Add(this_03,(TestObject **)local_60);
            }
            iVar8 = iVar8 + 1;
          } while (iVar8 < pTVar10->pointerCount);
        }
      } while (0 < (this_03->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).
                   count);
    }
    if (this_02->bucketCount != 0) {
      uVar9 = 0;
      do {
        iVar8 = (this_02->buckets).ptr[uVar9];
        while (iVar8 != -1) {
          pSVar2 = (this_02->entries).ptr;
          iVar1 = pSVar2[iVar8].
                  super_DefaultHashedEntry<Memory::WriteBarrierPtr<TestObject>,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<Memory::WriteBarrierPtr<TestObject>,_bool>.
                  super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<TestObject>,_bool>_>
                  .super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<TestObject>,_bool>.next;
          pTVar10 = pSVar2[iVar8].
                    super_DefaultHashedEntry<Memory::WriteBarrierPtr<TestObject>,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    .super_KeyValueEntry<Memory::WriteBarrierPtr<TestObject>,_bool>.
                    super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<TestObject>,_bool>_>
                    .super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<TestObject>,_bool>.key.
                    ptr;
          iVar8 = PAL_rand();
          uVar4 = iVar8 * -0x33333333 + 0x19999998;
          iVar8 = iVar1;
          if ((uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f) < 0x19999999) {
            TestObject::ClearOne(pTVar10);
          }
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < this_02->bucketCount);
    }
    iVar8 = PAL_rand();
    pTVar10 = local_70;
    if ((iVar8 * -0x55555555 + 0x2aaaaaaaU < 0x55555555) && (0 < local_70->pointerCount)) {
      iVar8 = 0;
      do {
        TestObject::Set(pTVar10,iVar8,(TestObject *)0x0);
        iVar8 = iVar8 + 1;
      } while (iVar8 < pTVar10->pointerCount);
    }
  } while( true );
}

Assistant:

void StressTester::Run()
{

    const int stackExtraBytes = 1000;
    const int stackPointers = 50;
    const size_t sizeRequired = sizeof(TestObject)+stackExtraBytes + stackPointers * sizeof(TestObject*) + OBJALIGN;
    char memory[sizeRequired];
    void *addr = AlignPtr(memory, OBJALIGN);

    TestObject *stack = new (addr) TestObject(stackExtraBytes, stackPointers);

    auto ObjectVisitor = [&](TestObject *object) {
        // Clear out one of the pointers.
        if (rand() % 5 == 0)
        {
            object->ClearOne();
        }

        // Maybe store a pointer on the stack.
        if (rand() % 25 == 0)
        {
            stack->SetRandom(object);
        }

        // Maybe add a stack reference to the current object
        if (rand() % 25 == 0)
        {
            object->SetRandom(stack->Get(rand() % stack->pointerCount));
        }

    };

    while (1)
    {
        TestObject *root = CreateLinkedList();
        TestObject::Visit(recycler, root);

        root = CreateTree();
        TestObject::Visit(recycler, root, ObjectVisitor);
        TestObject::Visit(recycler, root);

        root = CreateRandom();
        TestObject::Visit(recycler, root, ObjectVisitor);
        TestObject::Visit(recycler, root);

        TestObject::Visit(recycler, stack, [&](TestObject *object) {
            if (rand() % 10 == 0)
            {
                object->ClearOne();
            }
        });

        if (rand() % 3 == 0)
        {
            for (int i = 0; i < stack->pointerCount; ++i)
            {
                stack->Set(i, nullptr);
            }
        }
    }
}